

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O0

char * google::protobuf::internal::UTF8CoerceToStructurallyValid
                 (StringPiece *src_str,char *idst,char replace_char)

{
  int iVar1;
  stringpiece_ssize_type sVar2;
  char *pcVar3;
  char *offset;
  undefined1 local_60 [8];
  StringPiece str2;
  char *dst;
  char *srclimit;
  char *src;
  int n;
  int len;
  char *isrc;
  char replace_char_local;
  char *idst_local;
  StringPiece *src_str_local;
  
  src_str_local = (StringPiece *)StringPiece::data(src_str);
  sVar2 = StringPiece::length(src_str);
  iVar1 = UTF8SpnStructurallyValid(src_str);
  if (iVar1 != (int)sVar2) {
    pcVar3 = (char *)((long)&src_str_local->ptr_ + (long)(int)sVar2);
    str2.length_ = (stringpiece_ssize_type)idst;
    memmove(idst,src_str_local,(long)iVar1);
    str2.length_ = str2.length_ + iVar1;
    srclimit = (char *)((long)&src_str_local->ptr_ + (long)iVar1);
    while (src_str_local = (StringPiece *)idst, srclimit < pcVar3) {
      *(char *)str2.length_ = replace_char;
      offset = srclimit + 1;
      str2.length_ = str2.length_ + 1;
      StringPiece::StringPiece((StringPiece *)local_60,offset,(long)pcVar3 - (long)offset);
      iVar1 = UTF8SpnStructurallyValid((StringPiece *)local_60);
      memmove((void *)str2.length_,offset,(long)iVar1);
      str2.length_ = str2.length_ + iVar1;
      srclimit = offset + iVar1;
    }
  }
  return (char *)src_str_local;
}

Assistant:

char* UTF8CoerceToStructurallyValid(const StringPiece& src_str,
                                    char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}